

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O2

int run_test_fs_copyfile(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  char src [14];
  uv_fs_t req;
  
  builtin_strncpy(src + 8,"e_src",6);
  builtin_strncpy(src,"test_fil",8);
  loop = uv_default_loop();
  iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",-1,(uv_fs_cb)0x0);
  if (iVar1 == -0x16) {
    uv_fs_req_cleanup(&req);
    unlink(src);
    unlink("test_file_dst");
    iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",0,(uv_fs_cb)0x0);
    if (req.result == -2) {
      if (iVar1 == -2) {
        uv_fs_req_cleanup(&req);
        iVar1 = uv_fs_stat((uv_loop_t *)0x0,&req,"test_file_dst",(uv_fs_cb)0x0);
        if (iVar1 == 0) {
          pcVar3 = "r != 0";
          uVar2 = 0x7b;
        }
        else {
          uv_fs_req_cleanup(&req);
          touch_file(src,0xc);
          iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,src,0,(uv_fs_cb)0x0);
          if (iVar1 == 0) {
            uv_fs_req_cleanup(&req);
            iVar1 = uv_fs_stat((uv_loop_t *)0x0,&req,src,(uv_fs_cb)0x0);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = req.statbuf.st_size;
              eval_b = 0xc;
              if (req.statbuf.st_size == 0xc) {
                uv_fs_req_cleanup(&req);
                unlink(src);
                unlink("test_file_dst");
                iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,"test/fixtures/load_error.node",
                                       "test_file_dst",0,(uv_fs_cb)0x0);
                if (iVar1 == 0) {
                  handle_result(&req);
                  unlink("test_file_dst");
                  touch_file(src,0);
                  iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",0,(uv_fs_cb)0x0);
                  if (iVar1 == 0) {
                    handle_result(&req);
                    iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,"test/fixtures/load_error.node",
                                           "test_file_dst",0,(uv_fs_cb)0x0);
                    if (iVar1 == 0) {
                      handle_result(&req);
                      iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,"test/fixtures/load_error.node",
                                             "test_file_dst",1,(uv_fs_cb)0x0);
                      if (iVar1 == -0x11) {
                        uv_fs_req_cleanup(&req);
                        touch_file(src,1);
                        iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",0,
                                               (uv_fs_cb)0x0);
                        if (iVar1 == 0) {
                          handle_result(&req);
                          unlink("test_file_dst");
                          touch_file(src,0x2000);
                          iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,src,"test_file_dst",0,
                                                 (uv_fs_cb)0x0);
                          if (iVar1 == 0) {
                            handle_result(&req);
                            unlink(src);
                            unlink("test_file_dst");
                            iVar1 = uv_fs_copyfile(loop,&req,"test/fixtures/load_error.node",
                                                   "test_file_dst",0,handle_result);
                            if (iVar1 == 0) {
                              if (result_check_count == 5) {
                                uv_run(loop,UV_RUN_DEFAULT);
                                if (result_check_count == 6) {
                                  unlink("test_file_dst");
                                  iVar1 = uv_fs_copyfile(loop,&req,"test/fixtures/load_error.node",
                                                         "test_file_dst",-1,fail_cb);
                                  if (iVar1 == -0x16) {
                                    uv_run(loop,UV_RUN_DEFAULT);
                                    unlink("test_file_dst");
                                    iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,
                                                           "test/fixtures/load_error.node",
                                                           "test_file_dst",2,(uv_fs_cb)0x0);
                                    if (iVar1 == 0) {
                                      handle_result(&req);
                                      unlink("test_file_dst");
                                      iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,
                                                             "test/fixtures/load_error.node",
                                                             "test_file_dst",4,(uv_fs_cb)0x0);
                                      if (iVar1 < 1) {
                                        if (iVar1 == 0) {
                                          handle_result(&req);
                                        }
                                        unlink("test_file_dst");
                                        touch_file("test_file_dst",0);
                                        chmod("test_file_dst",0x124);
                                        iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,&req,
                                                               "test/fixtures/load_error.node",
                                                               "test_file_dst",0,(uv_fs_cb)0x0);
                                        if (req.result == -0xd) {
                                          if (iVar1 == -0xd) {
                                            uv_fs_req_cleanup(&req);
                                            unlink("test_file_dst");
                                            return 0;
                                          }
                                          pcVar3 = "r == UV_EACCES";
                                          uVar2 = 0xd5;
                                        }
                                        else {
                                          pcVar3 = "req.result == UV_EACCES";
                                          uVar2 = 0xd4;
                                        }
                                      }
                                      else {
                                        pcVar3 = "r <= 0";
                                        uVar2 = 199;
                                      }
                                    }
                                    else {
                                      pcVar3 = "r == 0";
                                      uVar2 = 0xc0;
                                    }
                                  }
                                  else {
                                    pcVar3 = "r == UV_EINVAL";
                                    uVar2 = 0xba;
                                  }
                                }
                                else {
                                  pcVar3 = "result_check_count == 6";
                                  uVar2 = 0xb5;
                                }
                              }
                              else {
                                pcVar3 = "result_check_count == 5";
                                uVar2 = 0xb3;
                              }
                            }
                            else {
                              pcVar3 = "r == 0";
                              uVar2 = 0xb2;
                            }
                          }
                          else {
                            pcVar3 = "r == 0";
                            uVar2 = 0xab;
                          }
                        }
                        else {
                          pcVar3 = "r == 0";
                          uVar2 = 0xa4;
                        }
                      }
                      else {
                        pcVar3 = "r == UV_EEXIST";
                        uVar2 = 0x9e;
                      }
                    }
                    else {
                      pcVar3 = "r == 0";
                      uVar2 = 0x99;
                    }
                  }
                  else {
                    pcVar3 = "r == 0";
                    uVar2 = 0x94;
                  }
                }
                else {
                  pcVar3 = "r == 0";
                  uVar2 = 0x8d;
                }
                goto LAB_00118224;
              }
              pcVar4 = "12";
              pcVar3 = "req.statbuf.st_size";
              uVar2 = 0x86;
            }
            else {
              pcVar4 = "0";
              pcVar3 = "r";
              uVar2 = 0x85;
            }
            fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-copyfile.c"
                    ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
            abort();
          }
          pcVar3 = "r == 0";
          uVar2 = 0x81;
        }
      }
      else {
        pcVar3 = "r == UV_ENOENT";
        uVar2 = 0x77;
      }
    }
    else {
      pcVar3 = "req.result == UV_ENOENT";
      uVar2 = 0x76;
    }
  }
  else {
    pcVar3 = "r == UV_EINVAL";
    uVar2 = 0x6f;
  }
LAB_00118224:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-copyfile.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fs_copyfile) {
#if defined(__ASAN__)
  RETURN_SKIP("Test does not currently work in ASAN");
#endif
  const char src[] = "test_file_src";
  uv_loop_t* loop;
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Fails with EINVAL if bad flags are passed. */
  r = uv_fs_copyfile(NULL, &req, src, dst, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&req);

  /* Fails with ENOENT if source does not exist. */
  unlink(src);
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(req.result == UV_ENOENT);
  ASSERT(r == UV_ENOENT);
  uv_fs_req_cleanup(&req);
  /* The destination should not exist. */
  r = uv_fs_stat(NULL, &req, dst, NULL);
  ASSERT(r != 0);
  uv_fs_req_cleanup(&req);

  /* Succeeds if src and dst files are identical. */
  touch_file(src, 12);
  r = uv_fs_copyfile(NULL, &req, src, src, 0, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);
  /* Verify that the src file did not get truncated. */
  r = uv_fs_stat(NULL, &req, src, NULL);
  ASSERT_EQ(r, 0);
  ASSERT_EQ(req.statbuf.st_size, 12);
  uv_fs_req_cleanup(&req);
  unlink(src);

  /* Copies file synchronously. Creates new file. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies a file of size zero. */
  unlink(dst);
  touch_file(src, 0);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies file synchronously. Overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Fails to overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_EXCL, NULL);
  ASSERT(r == UV_EEXIST);
  uv_fs_req_cleanup(&req);

  /* Truncates when an existing destination is larger than the source file. */
  touch_file(src, 1);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies a larger file. */
  unlink(dst);
  touch_file(src, 4096 * 2);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);
  unlink(src);

  /* Copies file asynchronously */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, 0, handle_result);
  ASSERT(r == 0);
  ASSERT(result_check_count == 5);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(result_check_count == 6);

  /* If the flags are invalid, the loop should not be kept open */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);

  /* Copies file using UV_FS_COPYFILE_FICLONE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies file using UV_FS_COPYFILE_FICLONE_FORCE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE_FORCE,
                     NULL);
  ASSERT(r <= 0);

  if (r == 0)
    handle_result(&req);

#ifndef _WIN32
  /* Copying respects permissions/mode. */
  unlink(dst);
  touch_file(dst, 0);
  chmod(dst, S_IRUSR|S_IRGRP|S_IROTH); /* Sets file mode to 444 (read-only). */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  /* On IBMi PASE, qsecofr users can overwrite read-only files */
# ifndef __PASE__
  ASSERT(req.result == UV_EACCES);
  ASSERT(r == UV_EACCES);
# endif
  uv_fs_req_cleanup(&req);
#endif

  unlink(dst); /* Cleanup */
  return 0;
}